

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O2

value_type * __thiscall
poplar::
map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
::find(map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
       *this,char_range key)

{
  uint8_t *puVar1;
  value_type *pvVar2;
  uint64_t pos;
  ulong uVar3;
  undefined8 *puVar4;
  char *pcVar5;
  ulong uVar6;
  uint8_t *puVar7;
  pair<const_int_*,_unsigned_long> pVar8;
  char_range key_local;
  
  key_local.end = key.end;
  puVar7 = key.begin;
  key_local.begin = puVar7;
  if (puVar7 == key_local.end) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar4 = &PTR__exception_00189a50;
    pcVar5 = 
    "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:76:key must be a non-empty string."
    ;
  }
  else {
    if (key_local.end[-1] == '\0') {
      if ((this->is_ready_ == true) && ((this->hash_trie_).size_ != 0)) {
        pos = 0;
        while( true ) {
          puVar1 = key_local.end;
          key_local.begin = puVar7;
          pVar8 = compact_bonsai_nlm<int,_16UL>::compare(&this->label_store_,pos,&key_local);
          uVar6 = pVar8.second;
          pvVar2 = pVar8.first;
          if ((puVar7 == puVar1) || (pvVar2 != (value_type *)0x0)) break;
          key_local.begin = key_local.begin + uVar6;
          uVar3 = this->lambda_;
          for (; uVar3 <= uVar6; uVar6 = uVar6 - uVar3) {
            pos = compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                  ::find_child(&this->hash_trie_,pos,0xff);
            if (pos == 0xffffffffffffffff) goto LAB_00165eee;
            uVar3 = this->lambda_;
          }
          uVar3 = (ulong)(this->codes_)._M_elems[*key_local.begin];
          if (uVar3 == 0xff) goto LAB_00165eee;
          pos = compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                ::find_child(&this->hash_trie_,pos,uVar6 << 8 | uVar3);
          if (pos == 0xffffffffffffffff) goto LAB_00165eee;
          puVar7 = key_local.begin + 1;
        }
      }
      else {
LAB_00165eee:
        pvVar2 = (value_type *)0x0;
      }
      return pvVar2;
    }
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar4 = &PTR__exception_00189a50;
    pcVar5 = 
    "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:77:The last character of key must be the null terminator."
    ;
  }
  puVar4[1] = pcVar5;
  __cxa_throw(puVar4,&exception::typeinfo,std::exception::~exception);
}

Assistant:

const value_type* find(char_range key) const {
        POPLAR_THROW_IF(key.empty(), "key must be a non-empty string.");
        POPLAR_THROW_IF(*(key.end - 1) != '\0', "The last character of key must be the null terminator.");

        if (!is_ready_ or hash_trie_.size() == 0) {
            return nullptr;
        }

        auto node_id = hash_trie_.get_root();

        while (!key.empty()) {
            auto [vptr, match] = label_store_.compare(node_id, key);
            if (vptr != nullptr) {
                return vptr;
            }

            key.begin += match;

            while (lambda_ <= match) {
                node_id = hash_trie_.find_child(node_id, step_symb);
                if (node_id == nil_id) {
                    return nullptr;
                }
                match -= lambda_;
            }

            if (codes_[*key.begin] == UINT8_MAX) {
                // Detecting an useless character
                return nullptr;
            }

            node_id = hash_trie_.find_child(node_id, make_symb_(*key.begin, match));
            if (node_id == nil_id) {
                return nullptr;
            }

            ++key.begin;
        }

        return label_store_.compare(node_id, key).first;
    }